

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O0

Type * get_struct_union_type(Denotation_Prototype *prototype)

{
  Type *type;
  Type_Struct_Union *ret;
  Denotation_Prototype *prototype_local;
  
  prototype->denotation = DT_Prototype;
  prototype->denotation = DT_Object;
  type = (Type *)calloc(1,0x20);
  type->specifier = prototype->specifier;
  *(Struct_Union **)(type + 1) = prototype->struct_union;
  *(byte *)&type[1].node =
       *(byte *)&type[1].node & 0xfe | (char)(prototype->field_0x48 << 7) >> 7 & 1U;
  *(byte *)&type[1].node =
       *(byte *)&type[1].node & 0xfd | ((char)(prototype->field_0x48 << 6) >> 7 & 1U) << 1;
  prototype_local = (Denotation_Prototype *)type_check_and_push(type,prototype->node,0x20);
  if (((prototype->constraint != TC_NONE) || (prototype->sign != TSIGN_NONE)) ||
     ((prototype->specifier != TS_UNION && (prototype->specifier != TS_STRUCT)))) {
    prototype_local = (Denotation_Prototype *)get_type_error((Type *)prototype_local);
  }
  return (Type *)prototype_local;
}

Assistant:

struct Type* get_struct_union_type(struct Denotation_Prototype *prototype)
{
	struct Type_Struct_Union *ret;
	
	assert(prototype->denotation=DT_Prototype);
	prototype->denotation=DT_Object;

	ret=calloc(1,sizeof(struct Type_Struct_Union));
	ret->specifier=prototype->specifier;
	ret->struct_union=prototype->struct_union;

	ret->is_const=prototype->is_const;
	ret->is_volatile=prototype->is_volatile;

	ret=(struct Type_Struct_Union*)type_check_and_push((struct Type*)ret,prototype->node,sizeof(struct Type_Struct_Union));
	if(prototype->constraint!=TC_NONE || prototype->sign!=TSIGN_NONE || (prototype->specifier!=TS_UNION && prototype->specifier!=TS_STRUCT))
	{
		return get_type_error((struct Type*)ret);
	}else
	{
		return (struct Type*)ret;
	}
}